

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O0

void __thiscall jsonChildren::doerase(jsonChildren *this,JSONNode **position,json_index_t number)

{
  uint uVar1;
  JSONNode **ppJVar2;
  JSONNode **ppJVar3;
  bool condition;
  allocator local_c9;
  json_string local_c8;
  allocator local_a1;
  json_string local_a0;
  allocator local_79;
  json_string local_78;
  allocator local_41;
  json_string local_40;
  json_index_t local_1c;
  JSONNode **ppJStack_18;
  json_index_t number_local;
  JSONNode **position_local;
  jsonChildren *this_local;
  
  local_1c = number;
  ppJStack_18 = position;
  position_local = (JSONNode **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Children is null doerase",&local_41);
  JSONDebug::_JSON_ASSERT(this != (jsonChildren *)0x0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  ppJVar2 = this->array;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"erasing something from a null array 2",&local_79);
  JSONDebug::_JSON_ASSERT(ppJVar2 != (JSONNode **)0x0,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  condition = this->array <= ppJStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"position is beneath the start of the array 2",&local_a1);
  JSONDebug::_JSON_ASSERT(condition,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ppJVar2 = ppJStack_18 + local_1c;
  ppJVar3 = this->array;
  uVar1 = this->mysize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"erasing out of bounds 2",&local_c9);
  JSONDebug::_JSON_ASSERT(ppJVar2 <= ppJVar3 + uVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if (ppJStack_18 + local_1c < this->array + this->mysize) {
    memmove(ppJStack_18,ppJStack_18 + local_1c,
            (((ulong)this->mysize - ((long)ppJStack_18 - (long)this->array >> 3)) - (ulong)local_1c)
            * 8);
    this->mysize = this->mysize - local_1c;
  }
  else {
    this->mysize = (json_index_t)((long)ppJStack_18 - (long)this->array >> 3);
  }
  return;
}

Assistant:

void jsonChildren::doerase(JSONNode ** position, json_index_t number) json_nothrow {
    JSON_ASSERT(this != 0, JSON_TEXT("Children is null doerase"));
    JSON_ASSERT(array != 0, JSON_TEXT("erasing something from a null array 2"));
    JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array 2"));
    JSON_ASSERT(position + number <= array + mysize, JSON_TEXT("erasing out of bounds 2"));
    if (position + number >= array + mysize){
	   mysize = (json_index_t)(position - array);
	   #ifndef JSON_ISO_STRICT
		  JSON_ASSERT((long long)position - (long long)array >= 0, JSON_TEXT("doing negative allocation"));
	   #endif
    } else {
	   std::memmove(position, position + number, (mysize - (position - array) - number) * sizeof(JSONNode *));
	   mysize -= number;
    }
}